

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SqlGenerator.cpp
# Opt level: O2

string * __thiscall
SqlGenerator::typeToStr_abi_cxx11_(string *__return_storage_ptr__,SqlGenerator *this,Type type)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch(type) {
  case Integer:
    pcVar2 = "int";
    paVar1 = &local_9;
    break;
  case Double:
    pcVar2 = "numeric";
    paVar1 = &local_a;
    break;
  case Short:
    pcVar2 = "int";
    paVar1 = &local_b;
    break;
  case U_Integer:
    pcVar2 = "int";
    paVar1 = &local_c;
    break;
  default:
    std::operator<<((ostream *)&std::cerr,
                    "This type does not exist  (SqlGenerator - typeToString)\n");
    exit(1);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

inline string SqlGenerator::typeToStr(Type type)
{
    switch (type)
    {
    case Type::Integer : return "int";
    case Type::Double : return "numeric";            
    case Type::Short : return "int";
    case Type::U_Integer : return "int";
    default :
        ERROR("This type does not exist  (SqlGenerator - typeToString)\n");
        exit(1);
    }
}